

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O1

size_t ZSTD_CCtxParams_getParameter(ZSTD_CCtx_params *CCtxParams,ZSTD_cParameter param,int *value)

{
  ZSTD_bufferMode_e ZVar1;
  
  if ((int)param < 0xca) {
    if ((int)param < 0xa0) {
      switch(param) {
      case ZSTD_c_compressionLevel:
        ZVar1 = CCtxParams->compressionLevel;
        break;
      case ZSTD_c_windowLog:
        ZVar1 = (CCtxParams->cParams).windowLog;
        break;
      case ZSTD_c_hashLog:
        ZVar1 = (CCtxParams->cParams).hashLog;
        break;
      case ZSTD_c_chainLog:
        ZVar1 = (CCtxParams->cParams).chainLog;
        break;
      case ZSTD_c_searchLog:
        ZVar1 = (CCtxParams->cParams).searchLog;
        break;
      case ZSTD_c_minMatch:
        ZVar1 = (CCtxParams->cParams).minMatch;
        break;
      case ZSTD_c_targetLength:
        ZVar1 = (CCtxParams->cParams).targetLength;
        break;
      case ZSTD_c_strategy:
        ZVar1 = (CCtxParams->cParams).strategy;
        break;
      default:
        if (param != ZSTD_c_experimentalParam2) {
          return 0xffffffffffffffd8;
        }
        ZVar1 = CCtxParams->format;
      }
    }
    else {
      switch(param) {
      case ZSTD_c_enableLongDistanceMatching:
        ZVar1 = (CCtxParams->ldmParams).enableLdm;
        break;
      case ZSTD_c_ldmHashLog:
        ZVar1 = (CCtxParams->ldmParams).hashLog;
        break;
      case ZSTD_c_ldmMinMatch:
        ZVar1 = (CCtxParams->ldmParams).minMatchLength;
        break;
      case ZSTD_c_ldmBucketSizeLog:
        ZVar1 = (CCtxParams->ldmParams).bucketSizeLog;
        break;
      case ZSTD_c_ldmHashRateLog:
        ZVar1 = (CCtxParams->ldmParams).hashRateLog;
        break;
      default:
        if (param == ZSTD_c_contentSizeFlag) {
          ZVar1 = (CCtxParams->fParams).contentSizeFlag;
        }
        else {
          if (param != ZSTD_c_checksumFlag) {
            return 0xffffffffffffffd8;
          }
          ZVar1 = (CCtxParams->fParams).checksumFlag;
        }
      }
    }
  }
  else {
    switch(param) {
    case ZSTD_c_experimentalParam3:
      ZVar1 = CCtxParams->forceWindow;
      break;
    case ZSTD_c_experimentalParam4:
      ZVar1 = CCtxParams->attachDictPref;
      break;
    case ZSTD_c_experimentalParam5:
      ZVar1 = CCtxParams->literalCompressionMode;
      break;
    case ZSTD_c_experimentalParam6:
      ZVar1 = (ZSTD_bufferMode_e)CCtxParams->targetCBlockSize;
      break;
    case ZSTD_c_experimentalParam7:
      ZVar1 = CCtxParams->srcSizeHint;
      break;
    case ZSTD_c_experimentalParam8:
      ZVar1 = CCtxParams->enableDedicatedDictSearch;
      break;
    case ZSTD_c_experimentalParam9:
      ZVar1 = CCtxParams->inBufferMode;
      break;
    case ZSTD_c_experimentalParam10:
      ZVar1 = CCtxParams->outBufferMode;
      break;
    case ZSTD_c_experimentalParam11:
      ZVar1 = CCtxParams->blockDelimiters;
      break;
    case ZSTD_c_experimentalParam12:
      ZVar1 = CCtxParams->validateSequences;
      break;
    case ZSTD_c_experimentalParam13:
      ZVar1 = CCtxParams->useBlockSplitter;
      break;
    case ZSTD_c_experimentalParam14:
      ZVar1 = CCtxParams->useRowMatchFinder;
      break;
    case ZSTD_c_experimentalParam15:
      ZVar1 = CCtxParams->deterministicRefPrefix;
      break;
    case ZSTD_c_experimentalParam16:
      ZVar1 = CCtxParams->prefetchCDictTables;
      break;
    case ZSTD_c_experimentalParam17:
      ZVar1 = CCtxParams->enableMatchFinderFallback;
      break;
    case ZSTD_c_experimentalParam18:
      ZVar1 = (ZSTD_bufferMode_e)CCtxParams->maxBlockSize;
      break;
    case ZSTD_c_experimentalParam19:
      ZVar1 = CCtxParams->searchForExternalRepcodes;
      break;
    default:
      if (param == ZSTD_c_dictIDFlag) {
        ZVar1 = (ZSTD_bufferMode_e)((CCtxParams->fParams).noDictIDFlag == 0);
      }
      else {
        if (param != ZSTD_c_nbWorkers) {
          return 0xffffffffffffffd8;
        }
        ZVar1 = ZSTD_bm_buffered;
        if (CCtxParams->nbWorkers != 0) {
          __assert_fail("CCtxParams->nbWorkers == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                        ,0x42e,
                        "size_t ZSTD_CCtxParams_getParameter(const ZSTD_CCtx_params *, ZSTD_cParameter, int *)"
                       );
        }
      }
    }
  }
  *value = ZVar1;
  return 0;
}

Assistant:

size_t ZSTD_CCtxParams_getParameter(
        ZSTD_CCtx_params const* CCtxParams, ZSTD_cParameter param, int* value)
{
    switch(param)
    {
    case ZSTD_c_format :
        *value = CCtxParams->format;
        break;
    case ZSTD_c_compressionLevel :
        *value = CCtxParams->compressionLevel;
        break;
    case ZSTD_c_windowLog :
        *value = (int)CCtxParams->cParams.windowLog;
        break;
    case ZSTD_c_hashLog :
        *value = (int)CCtxParams->cParams.hashLog;
        break;
    case ZSTD_c_chainLog :
        *value = (int)CCtxParams->cParams.chainLog;
        break;
    case ZSTD_c_searchLog :
        *value = CCtxParams->cParams.searchLog;
        break;
    case ZSTD_c_minMatch :
        *value = CCtxParams->cParams.minMatch;
        break;
    case ZSTD_c_targetLength :
        *value = CCtxParams->cParams.targetLength;
        break;
    case ZSTD_c_strategy :
        *value = (unsigned)CCtxParams->cParams.strategy;
        break;
    case ZSTD_c_contentSizeFlag :
        *value = CCtxParams->fParams.contentSizeFlag;
        break;
    case ZSTD_c_checksumFlag :
        *value = CCtxParams->fParams.checksumFlag;
        break;
    case ZSTD_c_dictIDFlag :
        *value = !CCtxParams->fParams.noDictIDFlag;
        break;
    case ZSTD_c_forceMaxWindow :
        *value = CCtxParams->forceWindow;
        break;
    case ZSTD_c_forceAttachDict :
        *value = CCtxParams->attachDictPref;
        break;
    case ZSTD_c_literalCompressionMode :
        *value = CCtxParams->literalCompressionMode;
        break;
    case ZSTD_c_nbWorkers :
#ifndef ZSTD_MULTITHREAD
        assert(CCtxParams->nbWorkers == 0);
#endif
        *value = CCtxParams->nbWorkers;
        break;
    case ZSTD_c_jobSize :
#ifndef ZSTD_MULTITHREAD
        RETURN_ERROR(parameter_unsupported, "not compiled with multithreading");
#else
        assert(CCtxParams->jobSize <= INT_MAX);
        *value = (int)CCtxParams->jobSize;
        break;
#endif
    case ZSTD_c_overlapLog :
#ifndef ZSTD_MULTITHREAD
        RETURN_ERROR(parameter_unsupported, "not compiled with multithreading");
#else
        *value = CCtxParams->overlapLog;
        break;
#endif
    case ZSTD_c_rsyncable :
#ifndef ZSTD_MULTITHREAD
        RETURN_ERROR(parameter_unsupported, "not compiled with multithreading");
#else
        *value = CCtxParams->rsyncable;
        break;
#endif
    case ZSTD_c_enableDedicatedDictSearch :
        *value = CCtxParams->enableDedicatedDictSearch;
        break;
    case ZSTD_c_enableLongDistanceMatching :
        *value = CCtxParams->ldmParams.enableLdm;
        break;
    case ZSTD_c_ldmHashLog :
        *value = CCtxParams->ldmParams.hashLog;
        break;
    case ZSTD_c_ldmMinMatch :
        *value = CCtxParams->ldmParams.minMatchLength;
        break;
    case ZSTD_c_ldmBucketSizeLog :
        *value = CCtxParams->ldmParams.bucketSizeLog;
        break;
    case ZSTD_c_ldmHashRateLog :
        *value = CCtxParams->ldmParams.hashRateLog;
        break;
    case ZSTD_c_targetCBlockSize :
        *value = (int)CCtxParams->targetCBlockSize;
        break;
    case ZSTD_c_srcSizeHint :
        *value = (int)CCtxParams->srcSizeHint;
        break;
    case ZSTD_c_stableInBuffer :
        *value = (int)CCtxParams->inBufferMode;
        break;
    case ZSTD_c_stableOutBuffer :
        *value = (int)CCtxParams->outBufferMode;
        break;
    case ZSTD_c_blockDelimiters :
        *value = (int)CCtxParams->blockDelimiters;
        break;
    case ZSTD_c_validateSequences :
        *value = (int)CCtxParams->validateSequences;
        break;
    case ZSTD_c_useBlockSplitter :
        *value = (int)CCtxParams->useBlockSplitter;
        break;
    case ZSTD_c_useRowMatchFinder :
        *value = (int)CCtxParams->useRowMatchFinder;
        break;
    case ZSTD_c_deterministicRefPrefix:
        *value = (int)CCtxParams->deterministicRefPrefix;
        break;
    case ZSTD_c_prefetchCDictTables:
        *value = (int)CCtxParams->prefetchCDictTables;
        break;
    case ZSTD_c_enableSeqProducerFallback:
        *value = CCtxParams->enableMatchFinderFallback;
        break;
    case ZSTD_c_maxBlockSize:
        *value = (int)CCtxParams->maxBlockSize;
        break;
    case ZSTD_c_searchForExternalRepcodes:
        *value = (int)CCtxParams->searchForExternalRepcodes;
        break;
    default: RETURN_ERROR(parameter_unsupported, "unknown parameter");
    }
    return 0;
}